

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O2

void __thiscall
Js::InterpreterStackFrame::
OP_LdNewTarget<Js::OpLayoutT_Reg1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutT_Reg1<Js::LayoutSizePolicy<(Js::LayoutSize)0>_> *playout)

{
  CallFlags flag;
  JavascriptFunction *value;
  uchar localRegisterID;
  
  flag = *(CallFlags *)(this + 0x1c);
  if ((flag & CallFlags_NewTarget) == CallFlags_None) {
    localRegisterID = playout->R0;
    if ((flag & CallFlags_New) == CallFlags_None) {
      SetReg<unsigned_char>
                (this,localRegisterID,*(Var *)(*(long *)(*(long *)(this + 0x78) + 8) + 0x430));
      return;
    }
    value = GetFunctionExpression(this);
  }
  else {
    localRegisterID = playout->R0;
    value = (JavascriptFunction *)
            CallInfo::GetNewTarget(flag,*(Var **)(this + 0x20),(uint)*(ushort *)(this + 0x18));
  }
  SetRegAllowStackVar<unsigned_char>(this,localRegisterID,value);
  return;
}

Assistant:

void InterpreterStackFrame::OP_LdNewTarget(const unaligned T* playout)
    {
        if (Js::CallInfo::HasNewTarget(this->m_callFlags))
        {
            SetRegAllowStackVar(playout->R0, (Js::RecyclableObject*)Js::CallInfo::GetNewTarget(this->m_callFlags, this->m_inParams, (ArgSlot)this->m_inSlotsCount));
        }
        else if (this->m_callFlags & CallFlags_New)
        {
            SetRegAllowStackVar(playout->R0, this->GetFunctionExpression());
        }
        else
        {
            SetReg(playout->R0, this->GetScriptContext()->GetLibrary()->GetUndefined());
        }
    }